

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opensketch.h
# Opt level: O3

void __thiscall OpenSketch<4U>::OpenSketch(OpenSketch<4U> *this,int num,int _HIT)

{
  int iVar1;
  ulong uVar2;
  ulong *puVar3;
  undefined8 *puVar4;
  int *__s;
  KV<4U> *__s_00;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  
  (this->super_Abstract<4U>).name._M_dataplus._M_p =
       (pointer)&(this->super_Abstract<4U>).name.field_2;
  (this->super_Abstract<4U>).name._M_string_length = 0;
  (this->super_Abstract<4U>).name.field_2._M_local_buf[0] = '\0';
  (this->super_Abstract<4U>).sep._M_dataplus._M_p = (pointer)&(this->super_Abstract<4U>).sep.field_2
  ;
  (this->super_Abstract<4U>).sep._M_string_length = 0;
  (this->super_Abstract<4U>).sep.field_2._M_local_buf[0] = '\0';
  (this->super_Abstract<4U>).pr = 0.0;
  (this->super_Abstract<4U>).cr = 0.0;
  (this->super_Abstract<4U>).aae = 0.0;
  (this->super_Abstract<4U>).are = 0.0;
  (this->super_Abstract<4U>)._vptr_Abstract = (_func_int **)&PTR_Init_00111cb8;
  (this->mp)._M_h._M_buckets = &(this->mp)._M_h._M_single_bucket;
  (this->mp)._M_h._M_bucket_count = 1;
  auVar7 = ZEXT416(0) << 0x40;
  (this->mp)._M_h._M_before_begin = (__node_base)auVar7._0_8_;
  (this->mp)._M_h._M_element_count = auVar7._8_8_;
  (this->mp)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->mp)._M_h._M_rehash_policy._M_next_resize = auVar7;
  (this->super_Abstract<4U>).HIT = _HIT;
  *(undefined4 *)&(this->super_Abstract<4U>).field_0x6c = 0x80;
  this->CAPACITY = 0xfa;
  this->heap_num = 0;
  uVar2 = ((long)num - 12000U) / 0x14;
  iVar1 = (int)uVar2;
  this->COLUMN = iVar1;
  lVar6 = uVar2 << 0x20;
  uVar2 = (ulong)iVar1;
  puVar3 = (ulong *)operator_new__(-(ulong)(uVar2 >> 0x3c != 0) | lVar6 >> 0x1c | 8);
  *puVar3 = uVar2;
  if (lVar6 != 0) {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)puVar3 + lVar5 + 8) = 0x80;
      puVar4 = (undefined8 *)operator_new__(0x11);
      *(undefined8 **)((long)puVar3 + lVar5 + 0x10) = puVar4;
      *puVar4 = 0;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      lVar5 = lVar5 + 0x10;
    } while (uVar2 * 0x10 != lVar5);
  }
  this->bitset = (BitSet *)(puVar3 + 1);
  uVar2 = 0xffffffffffffffff;
  if (-1 < iVar1) {
    uVar2 = lVar6 >> 0x1e;
  }
  __s = (int *)operator_new__(uVar2);
  this->counter = __s;
  memset(__s,0,lVar6 >> 0x1e);
  __s_00 = (KV<4U> *)operator_new__(2000);
  this->heap = __s_00;
  memset(__s_00,0,2000);
  (this->super_Abstract<4U>).pr = 0.0;
  (this->super_Abstract<4U>).cr = 0.0;
  (this->super_Abstract<4U>).aae = 0.0;
  (this->super_Abstract<4U>).are = 0.0;
  std::__cxx11::string::_M_replace((ulong)&(this->super_Abstract<4U>).sep,0,(char *)0x0,0x10c864);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_Abstract<4U>).name,0,
             (char *)(this->super_Abstract<4U>).name._M_string_length,0x10c86b);
  return;
}

Assistant:

OpenSketch(int num, int _HIT) {
		this->HIT = _HIT;
		LENGTH = 128;
		CAPACITY = 250;
		COLUMN = (num - 6 * CAPACITY * sizeof(KV<DATA_LEN>)) / 20;
		heap_num = 0;
		bitset = new BitSet[COLUMN];
		counter = new int[COLUMN];
		memset(counter, 0, sizeof(int) * COLUMN);
		heap = new KV<DATA_LEN>[CAPACITY];
		memset(heap, 0, sizeof(KV<DATA_LEN>) * CAPACITY);
		this->aae = this->are = this->pr = this->cr = 0;
		this->sep = "\t\t";
		this->name = "OpenSketch";
	}